

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

int main(void)

{
  test_location<void_(*)()> test;
  test_location<void_(*)()> test_00;
  test_location<void_(*)()> test_01;
  test_location<void_(*)()> test_02;
  test_location<void_(*)()> test_03;
  test_location<void_(*)()> test_04;
  test_location<void_(*)()> test_05;
  test_location<void_(*)()> test_06;
  test_location<void_(*)()> test_07;
  test_location<void_(*)()> test_08;
  test_location<void_(*)()> test_09;
  test_location<void_(*)()> test_10;
  test_location<void_(*)()> test_11;
  test_location<void_(*)()> test_12;
  test_location<void_(*)()> test_13;
  source_location sVar1;
  test local_720;
  char *local_6e8;
  int local_6e0;
  source_location local_6d8;
  anon_class_1_0_00000001 local_6c1;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  test local_6a8;
  char *local_670;
  int local_668;
  source_location local_660;
  anon_class_1_0_00000001 local_649;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  test local_630;
  char *local_5f8;
  int local_5f0;
  source_location local_5e8;
  anon_class_1_0_00000001 local_5d1;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  test local_5b8;
  char *local_580;
  int local_578;
  source_location local_570;
  anon_class_1_0_00000001 local_559;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  test local_540;
  char *local_508;
  int local_500;
  source_location local_4f8;
  anon_class_1_0_00000001 local_4e1;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  test local_4c8;
  char *local_490;
  int local_488;
  source_location local_480;
  anon_class_1_0_00000001 local_469;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  test local_450;
  char *local_418;
  int local_410;
  source_location local_408;
  anon_class_1_0_00000001 local_3f1;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  test local_3d8;
  char *local_3a0;
  int local_398;
  source_location local_390;
  anon_class_1_0_00000001 local_379;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  test local_360;
  char *local_328;
  int local_320;
  source_location local_318;
  anon_class_1_0_00000001 local_301;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  test local_2e8;
  char *local_2b0;
  int local_2a8;
  source_location local_2a0;
  anon_class_1_0_00000001 local_289;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  test local_270;
  char *local_238;
  int local_230;
  source_location local_228;
  anon_class_1_0_00000001 local_211;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  test local_1f8;
  char *local_1c0;
  int local_1b8;
  source_location local_1b0;
  anon_class_1_0_00000001 local_199;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  test local_180;
  char *local_148;
  int local_140;
  source_location local_138;
  anon_class_1_0_00000001 local_121;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  test local_108;
  char *local_d0;
  int local_c8;
  source_location local_c0;
  anon_class_1_0_00000001 local_a9;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  test local_80;
  char *local_48;
  int local_40;
  source_location local_38;
  anon_class_1_0_00000001 local_21;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x2a);
  local_48 = sVar1.file_;
  local_40 = sVar1.line_;
  local_38.file_ = local_48;
  local_38.line_ = local_40;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__0>
            ((test_location<void(*)()> *)&local_20,&local_21,&local_38);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_80,"named objective",0xf);
  test.location.file_ = (char *)uStack_18;
  test.test = (_func_void *)local_20;
  test.location._8_8_ = local_10;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_80,test);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_80);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x3f);
  local_d0 = sVar1.file_;
  local_c8 = sVar1.line_;
  local_c0.file_ = local_d0;
  local_c0.line_ = local_c8;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__1>
            ((test_location<void(*)()> *)&local_a8,&local_a9,&local_c0);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_108,"no-named objective",0x12);
  test_00.location.file_ = (char *)uStack_a0;
  test_00.test = (_func_void *)local_a8;
  test_00.location._8_8_ = local_98;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_108,test_00);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_108);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x52);
  local_148 = sVar1.file_;
  local_140 = sVar1.line_;
  local_138.file_ = local_148;
  local_138.line_ = local_140;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__2>
            ((test_location<void(*)()> *)&local_120,&local_121,&local_138);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_180,"small lp",8);
  test_01.location.file_ = (char *)uStack_118;
  test_01.test = (_func_void *)local_120;
  test_01.location._8_8_ = local_110;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_180,test_01);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_180);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x98);
  local_1c0 = sVar1.file_;
  local_1b8 = sVar1.line_;
  local_1b0.file_ = local_1c0;
  local_1b0.line_ = local_1b8;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__3>
            ((test_location<void(*)()> *)&local_198,&local_199,&local_1b0);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1f8,"quadratic lp",0xc);
  test_02.location.file_ = (char *)uStack_190;
  test_02.test = (_func_void *)local_198;
  test_02.location._8_8_ = local_188;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1f8,test_02);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_1f8);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0xe3);
  local_238 = sVar1.file_;
  local_230 = sVar1.line_;
  local_228.file_ = local_238;
  local_228.line_ = local_230;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__4>
            ((test_location<void(*)()> *)&local_210,&local_211,&local_228);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_270,"quadratic 2",0xb);
  test_03.location.file_ = (char *)uStack_208;
  test_03.test = (_func_void *)local_210;
  test_03.location._8_8_ = local_200;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_270,test_03);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_270);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x138);
  local_2b0 = sVar1.file_;
  local_2a8 = sVar1.line_;
  local_2a0.file_ = local_2b0;
  local_2a0.line_ = local_2a8;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__5>
            ((test_location<void(*)()> *)&local_288,&local_289,&local_2a0);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_2e8,"quadratic 3",0xb);
  test_04.location.file_ = (char *)uStack_280;
  test_04.test = (_func_void *)local_288;
  test_04.location._8_8_ = local_278;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_2e8,test_04);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_2e8);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x187);
  local_328 = sVar1.file_;
  local_320 = sVar1.line_;
  local_318.file_ = local_328;
  local_318.line_ = local_320;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__6>
            ((test_location<void(*)()> *)&local_300,&local_301,&local_318);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_360,"quadratic 4",0xb);
  test_05.location.file_ = (char *)uStack_2f8;
  test_05.test = (_func_void *)local_300;
  test_05.location._8_8_ = local_2f0;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_360,test_05);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_360);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x1d2);
  local_3a0 = sVar1.file_;
  local_398 = sVar1.line_;
  local_390.file_ = local_3a0;
  local_390.line_ = local_398;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__7>
            ((test_location<void(*)()> *)&local_378,&local_379,&local_390);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_3d8,"quadratic 5",0xb);
  test_06.location.file_ = (char *)uStack_370;
  test_06.test = (_func_void *)local_378;
  test_06.location._8_8_ = local_368;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_3d8,test_06);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_3d8);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x227);
  local_418 = sVar1.file_;
  local_410 = sVar1.line_;
  local_408.file_ = local_418;
  local_408.line_ = local_410;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__8>
            ((test_location<void(*)()> *)&local_3f0,&local_3f1,&local_408);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_450,"quadratic 6",0xb);
  test_07.location.file_ = (char *)uStack_3e8;
  test_07.test = (_func_void *)local_3f0;
  test_07.location._8_8_ = local_3e0;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_450,test_07);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_450);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x276);
  local_490 = sVar1.file_;
  local_488 = sVar1.line_;
  local_480.file_ = local_490;
  local_480.line_ = local_488;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__9>
            ((test_location<void(*)()> *)&local_468,&local_469,&local_480);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_4c8,"assignment_problem 0",0x14);
  test_08.location.file_ = (char *)uStack_460;
  test_08.test = (_func_void *)local_468;
  test_08.location._8_8_ = local_458;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_4c8,test_08);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_4c8);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x295);
  local_508 = sVar1.file_;
  local_500 = sVar1.line_;
  local_4f8.file_ = local_508;
  local_4f8.line_ = local_500;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__10>
            ((test_location<void(*)()> *)&local_4e0,&local_4e1,&local_4f8);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_540,"geom-30a-3-ext_1000_support",0x1b);
  test_09.location.file_ = (char *)uStack_4d8;
  test_09.test = (_func_void *)local_4e0;
  test_09.location._8_8_ = local_4d0;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_540,test_09);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_540);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x2a6);
  local_580 = sVar1.file_;
  local_578 = sVar1.line_;
  local_570.file_ = local_580;
  local_570.line_ = local_578;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__11>
            ((test_location<void(*)()> *)&local_558,&local_559,&local_570);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_5b8,"general",7);
  test_10.location.file_ = (char *)uStack_550;
  test_10.test = (_func_void *)local_558;
  test_10.location._8_8_ = local_548;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_5b8,test_10);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_5b8);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x2b6);
  local_5f8 = sVar1.file_;
  local_5f0 = sVar1.line_;
  local_5e8.file_ = local_5f8;
  local_5e8.line_ = local_5f0;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__12>
            ((test_location<void(*)()> *)&local_5d0,&local_5d1,&local_5e8);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_630,"sudoku",6);
  test_11.location.file_ = (char *)uStack_5c8;
  test_11.test = (_func_void *)local_5d0;
  test_11.location._8_8_ = local_5c0;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_630,test_11);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_630);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x2c4);
  local_670 = sVar1.file_;
  local_668 = sVar1.line_;
  local_660.file_ = local_670;
  local_660.line_ = local_668;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__13>
            ((test_location<void(*)()> *)&local_648,&local_649,&local_660);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_6a8,"8_queens_puzzle",0xf);
  test_12.location.file_ = (char *)uStack_640;
  test_12.test = (_func_void *)local_648;
  test_12.location._8_8_ = local_638;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_6a8,test_12);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_6a8);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp"
                     ,0x2d3);
  local_6e8 = sVar1.file_;
  local_6e0 = sVar1.line_;
  local_6d8.file_ = local_6e8;
  local_6d8.line_ = local_6e0;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__14>
            ((test_location<void(*)()> *)&local_6c0,&local_6c1,&local_6d8);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_720,"vm",2);
  test_13.location.file_ = (char *)uStack_6b8;
  test_13.test = (_func_void *)local_6c0;
  test_13.location._8_8_ = local_6b0;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_720,test_13);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_720);
  return 0;
}

Assistant:

int
main()
{
    using namespace boost::ut;

    "named objective"_test = [] {
        const char* example = "maximize\n"
            "x0: +x1 + 2x2 + 3x3 - 100\n"
            "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example);

        auto pb = baryonyx::make_problem(*ctx, iss);
        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3_ul);
        expect(pb.objective.elements[0].factor == 1_i);
        expect(pb.objective.elements[0].variable_index == 0_i);
        expect(pb.objective.elements[1].factor == 2_i);
        expect(pb.objective.elements[1].variable_index == 1_i);
        expect(pb.objective.elements[2].factor == 3_i);
        expect(pb.objective.elements[2].variable_index == 2_i);
        expect(pb.objective.value == -100.0_d);
    };

    "no-named objective"_test = [] {
        const char* example = "maximize\n"
            "st: x1 + x2 + x3 = 1\n"
            "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example);

        auto pb = baryonyx::make_problem(*ctx, iss);
        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 0_ul);
        expect(pb.vars.names.size() == 3_ul);
        expect(pb.vars.values.size() == 3_ul);
        expect(pb.less_constraints.size() == 0_ul);
        expect(pb.greater_constraints.size() == 0_ul);
        expect(pb.equal_constraints.size() == 1_ul);
    };

    "small lp"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);
        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3_ul);
        expect(pb.objective.elements[0].factor == 1_i);
        expect(pb.objective.elements[0].variable_index == 0_i);
        expect(pb.objective.elements[1].factor == 2_i);
        expect(pb.objective.elements[1].variable_index == 1_i);
        expect(pb.objective.elements[2].factor == 3_i);
        expect(pb.objective.elements[2].variable_index == 2_i);
        expect(pb.objective.value == -100.0_d);

        expect(pb.vars.names.size() == 3_ul);
        expect(pb.vars.values.size() == 3_ul);
        expect(pb.less_constraints.size() == 3_ul);

        expect(pb.less_constraints[0].elements.size() == 3_ul);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0_i);
        expect(pb.less_constraints[0].elements[1].factor == 1_i);
        expect(pb.less_constraints[0].elements[1].variable_index == 1_i);
        expect(pb.less_constraints[0].elements[2].factor == 1_i);
        expect(pb.less_constraints[0].elements[2].variable_index == 2_i);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3_ul);
        expect(pb.less_constraints[1].elements[0].factor == 1_i);
        expect(pb.less_constraints[1].elements[0].variable_index == 0_i);
        expect(pb.less_constraints[1].elements[1].factor == -3_i);
        expect(pb.less_constraints[1].elements[1].variable_index == 1_i);
        expect(pb.less_constraints[1].elements[2].factor == 1_i);
        expect(pb.less_constraints[1].elements[2].variable_index == 2_i);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3_ul);
        expect(pb.less_constraints[1].elements[0].factor == 1_i);
        expect(pb.less_constraints[2].elements[0].variable_index == 0_i);
        expect(pb.less_constraints[2].elements[1].factor == -3_i);
        expect(pb.less_constraints[2].elements[1].variable_index == 1_i);
        expect(pb.less_constraints[2].elements[2].factor == 1_i);
        expect(pb.less_constraints[2].elements[2].variable_index == 2_i);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0_i);
        expect(pb.vars.values[1].min == 0_i);
        expect(pb.vars.values[2].min == 0_i);

        expect(pb.vars.values[0].max == 40_i);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic lp"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "- [] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 0);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 2"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "- [ -x1^2 - 17x1*x2 + 5x2^2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 3);

        expect(pb.objective.qelements[0].factor == 1.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 0);
        expect(pb.objective.qelements[1].factor == 17.0 / 2.0);
        expect(pb.objective.qelements[1].variable_index_a == 0);
        expect(pb.objective.qelements[1].variable_index_b == 1);
        expect(pb.objective.qelements[2].factor == -5.0 / 2.0);
        expect(pb.objective.qelements[2].variable_index_a == 1);
        expect(pb.objective.qelements[2].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 3"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "- [ -x1*x2 - 17x1*x2 + 5x1*x2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 1);

        expect(pb.objective.qelements[0].factor == 13.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 4"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "+ [] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 0);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 5"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "+ [ -x1^2 - 17x1*x2 + 5x2^2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 3);

        expect(pb.objective.qelements[0].factor == -1.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 0);
        expect(pb.objective.qelements[1].factor == -17.0 / 2.0);
        expect(pb.objective.qelements[1].variable_index_a == 0);
        expect(pb.objective.qelements[1].variable_index_b == 1);
        expect(pb.objective.qelements[2].factor == 5.0 / 2.0);
        expect(pb.objective.qelements[2].variable_index_a == 1);
        expect(pb.objective.qelements[2].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 6"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "+ [ -x1*x2 - 17x1*x2 + 5x1*x2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 1);

        expect(pb.objective.qelements[0].factor == -13.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "assignment_problem 0"_test = [] {
        auto ctx = baryonyx::make_context(4);
        std::ifstream ifs;

        std::vector<std::vector<int>> values(3);

        values[0] = { 0, 0, 1, 0, 0, 1, 0, 0, 1, 0, 0, 0, 0, 0, 0, 1 };
        values[1] = { 0, 1, 0, 0, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0 };
        values[2] = { 0, 1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1, 1, 0, 0, 0 };

        for (int i = 1; i != 4; ++i) {
            std::string filepath{ EXAMPLES_DIR "/assignment_problem_" };
            filepath += std::to_string(i);
            filepath += ".lp";

            auto pb = baryonyx::make_problem(ctx, filepath);

            expect(pb);
            expect(pb.status == baryonyx::file_format_error_tag::success);
            expect(pb.vars.names.size() == 16);
            expect(pb.vars.values.size() == 16);

            std::stringstream ss;
            ss << pb;

            auto pb2 = baryonyx::make_problem(*ctx, ss);

            expect(pb == pb2);
        }
    };

    "geom-30a-3-ext_1000_support"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(
          ctx, EXAMPLES_DIR "/geom-30a-3-ext_1000_support.lp");

        expect(pb.type == baryonyx::objective_function_type::minimize);
        expect(pb.vars.names.size() == 819);
        expect(pb.vars.values.size() == 819);

        baryonyx::index nb{ 0 };
        for (auto& elem : pb.vars.values)
            if (elem.type == baryonyx::variable_type::binary)
                ++nb;

        expect(nb == 90);
    };

    "general"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/general.lp");

        expect(pb.type == baryonyx::objective_function_type::minimize);
        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);

        baryonyx::index nb{ 0 };
        for (auto& elem : pb.vars.values)
            if (elem.type == baryonyx::variable_type::general)
                ++nb;

        expect(nb == 3);
    };

    "sudoku"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/sudoku.lp");

        expect(pb.vars.names.size() == 81);
        expect(pb.vars.values.size() == 81);

        for (auto& vv : pb.vars.values) {
            expect(vv.min == 1);
            expect(vv.max == 9);
            expect(vv.type == baryonyx::variable_type::general);
        }
    };

    "8_queens_puzzle"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb =
          baryonyx::make_problem(ctx, EXAMPLES_DIR "/8_queens_puzzle.lp");

        expect(pb.vars.names.size() == 64);
        expect(pb.vars.values.size() == 64);

        for (auto& vv : pb.vars.values) {
            expect(vv.min == 0);
            expect(vv.max == 1);
            expect(vv.type == baryonyx::variable_type::binary);
        }
    };

    "vm"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/vm.lp");
    };
}